

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O3

FindInfo absl::lts_20240722::container_internal::anon_unknown_1::
         FindInsertPositionWithGrowthOrRehash
                   (CommonFields *common,size_t hash,PolicyFunctions *policy)

{
  ulong uVar1;
  void *pvVar2;
  size_t slot_size;
  _func_size_t_void_ptr_void_ptr *p_Var3;
  _func_void_void_ptr_void_ptr_void_ptr *p_Var4;
  ulong uVar5;
  ctrl_t *pcVar6;
  size_t sVar7;
  void *pvVar8;
  size_t hash_00;
  size_t i;
  ctrl_t *pcVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ctrl_t cVar13;
  void *pvVar14;
  void *pvVar15;
  FindInfo FVar16;
  HashtablezInfoHandle in_stack_ffffffffffffff78;
  size_t local_68;
  
  uVar1 = common->capacity_;
  if ((uVar1 < 0x11) || (uVar1 * 0x19 < (common->size_ & 0xffffffffffffffe) * 0x10)) {
    if ((uVar1 + 1 & uVar1) != 0) {
      __assert_fail("IsValidCapacity(n) || n == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x5cc,"size_t absl::container_internal::NextCapacity(size_t)");
    }
    (*policy->resize)(common,uVar1 * 2 + 1,in_stack_ffffffffffffff78);
  }
  else {
    if ((uVar1 + 1 & uVar1) != 0) {
      __assert_fail("IsValidCapacity(capacity)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0xc4,
                    "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                   );
    }
    pvVar2 = *(void **)((long)&common->heap_or_soo_ + 8);
    pcVar9 = (common->heap_or_soo_).heap.control;
    ConvertDeletedToEmptyAndFullToDeleted(pcVar9,uVar1);
    pvVar8 = (*policy->hash_fn)(common);
    slot_size = policy->slot_size;
    p_Var3 = policy->hash_slot;
    p_Var4 = policy->transfer;
    local_68 = 0xffffffffffffffff;
    uVar11 = 0;
    pvVar15 = pvVar2;
    do {
      if (pvVar15 != (void *)(uVar11 * slot_size + (long)pvVar2)) {
        __assert_fail("slot_ptr == SlotAddress(slot_array, i, slot_size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                      ,0xe7,
                      "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                     );
      }
      sVar7 = uVar11;
      if ((pcVar9[uVar11] != kEmpty) && (sVar7 = local_68, pcVar9[uVar11] == kDeleted)) {
        hash_00 = (*p_Var3)(pvVar8,pvVar15);
        FVar16 = find_first_non_full<void>(common,hash_00);
        i = FVar16.offset;
        uVar5 = common->capacity_;
        if ((uVar5 + 1 & uVar5) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x145,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        pcVar6 = (common->heap_or_soo_).heap.control;
        uVar12 = (hash_00 >> 7 ^ (ulong)pcVar6 >> 0xc) & uVar5;
        cVar13 = (ctrl_t)hash_00;
        if (((uVar11 - uVar12 ^ i - uVar12) & uVar1) < 0x10) {
          if (uVar5 <= uVar11) {
            __assert_fail("i < c.capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x70c,
                          "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                         );
          }
          pcVar6[uVar11] = cVar13 & ~kEmpty;
          pcVar6[(ulong)((uint)uVar5 & 0xf) + (uVar11 - 0xf & uVar5)] = cVar13 & ~kEmpty;
        }
        else {
          pvVar10 = (void *)(i * slot_size + (long)pvVar2);
          if (pcVar9[i] == kDeleted) {
            SetCtrl(common,i,cVar13 & ~kEmpty,slot_size);
            if (local_68 == 0xffffffffffffffff) {
              local_68 = FindEmptySlot(uVar11 + 1,uVar1,pcVar9);
            }
            pvVar14 = (void *)(local_68 * slot_size + (long)pvVar2);
            (*p_Var4)(common,pvVar14,pvVar10);
            (*p_Var4)(common,pvVar10,pvVar15);
            (*p_Var4)(common,pvVar15,pvVar14);
            uVar11 = uVar11 - 1;
            pvVar15 = (void *)((long)pvVar15 - slot_size);
            sVar7 = local_68;
          }
          else {
            if (pcVar9[i] != kEmpty) {
              __assert_fail("IsDeleted(ctrl[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                            ,0x10b,
                            "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                           );
            }
            SetCtrl(common,i,cVar13 & ~kEmpty,slot_size);
            (*p_Var4)(common,pvVar10,pvVar15);
            SetCtrl(common,uVar11,kEmpty,slot_size);
            sVar7 = uVar11;
          }
        }
      }
      local_68 = sVar7;
      uVar11 = uVar11 + 1;
      pvVar15 = (void *)((long)pvVar15 + slot_size);
    } while (uVar11 != uVar1);
    pcVar9 = (common->heap_or_soo_).heap.control + -8;
    if (((ulong)pcVar9 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x56f,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
    }
    uVar1 = common->capacity_;
    if ((uVar1 == 0) || ((uVar1 + 1 & uVar1) != 0)) {
      __assert_fail("IsValidCapacity(capacity)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x5ea,"size_t absl::container_internal::CapacityToGrowth(size_t)");
    }
    uVar11 = common->size_;
    *(ulong *)pcVar9 = uVar1 - ((uVar11 >> 1) + (uVar1 >> 3));
    if ((uVar11 & 1) != 0) {
      CommonFields::backing_array_start(common);
    }
  }
  FVar16 = find_first_non_full<void>(common,hash);
  return FVar16;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
FindInfo FindInsertPositionWithGrowthOrRehash(CommonFields& common, size_t hash,
                                              const PolicyFunctions& policy) {
  const size_t cap = common.capacity();
  if (cap > Group::kWidth &&
      // Do these calculations in 64-bit to avoid overflow.
      common.size() * uint64_t{32} <= cap * uint64_t{25}) {
    // Squash DELETED without growing if there is enough capacity.
    //
    // Rehash in place if the current size is <= 25/32 of capacity.
    // Rationale for such a high factor: 1) DropDeletesWithoutResize() is
    // faster than resize, and 2) it takes quite a bit of work to add
    // tombstones.  In the worst case, seems to take approximately 4
    // insert/erase pairs to create a single tombstone and so if we are
    // rehashing because of tombstones, we can afford to rehash-in-place as
    // long as we are reclaiming at least 1/8 the capacity without doing more
    // than 2X the work.  (Where "work" is defined to be size() for rehashing
    // or rehashing in place, and 1 for an insert or erase.)  But rehashing in
    // place is faster per operation than inserting or even doubling the size
    // of the table, so we actually afford to reclaim even less space from a
    // resize-in-place.  The decision is to rehash in place if we can reclaim
    // at about 1/8th of the usable capacity (specifically 3/28 of the
    // capacity) which means that the total cost of rehashing will be a small
    // fraction of the total work.
    //
    // Here is output of an experiment using the BM_CacheInSteadyState
    // benchmark running the old case (where we rehash-in-place only if we can
    // reclaim at least 7/16*capacity) vs. this code (which rehashes in place
    // if we can recover 3/32*capacity).
    //
    // Note that although in the worst-case number of rehashes jumped up from
    // 15 to 190, but the number of operations per second is almost the same.
    //
    // Abridged output of running BM_CacheInSteadyState benchmark from
    // raw_hash_set_benchmark.   N is the number of insert/erase operations.
    //
    //      | OLD (recover >= 7/16        | NEW (recover >= 3/32)
    // size |    N/s LoadFactor NRehashes |    N/s LoadFactor NRehashes
    //  448 | 145284       0.44        18 | 140118       0.44        19
    //  493 | 152546       0.24        11 | 151417       0.48        28
    //  538 | 151439       0.26        11 | 151152       0.53        38
    //  583 | 151765       0.28        11 | 150572       0.57        50
    //  628 | 150241       0.31        11 | 150853       0.61        66
    //  672 | 149602       0.33        12 | 150110       0.66        90
    //  717 | 149998       0.35        12 | 149531       0.70       129
    //  762 | 149836       0.37        13 | 148559       0.74       190
    //  807 | 149736       0.39        14 | 151107       0.39        14
    //  852 | 150204       0.42        15 | 151019       0.42        15
    DropDeletesWithoutResize(common, policy);
  } else {
    // Otherwise grow the container.
    policy.resize(common, NextCapacity(cap), HashtablezInfoHandle{});
  }
  // This function is typically called with tables containing deleted slots.
  // The table will be big and `FindFirstNonFullAfterResize` will always
  // fallback to `find_first_non_full`. So using `find_first_non_full` directly.
  return find_first_non_full(common, hash);
}